

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemTools.cxx
# Opt level: O1

void cmsys::SystemToolsAppendComponents
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *out_components,const_iterator first,const_iterator last)

{
  size_t __n;
  int iVar1;
  ulong uVar2;
  const_iterator i;
  
  if (SystemToolsAppendComponents(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>)
      ::up_abi_cxx11_ == '\0') {
    iVar1 = __cxa_guard_acquire(&SystemToolsAppendComponents(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>)
                                 ::up_abi_cxx11_);
    if (iVar1 != 0) {
      SystemToolsAppendComponents(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>)
      ::up_abi_cxx11_._M_dataplus._M_p =
           (pointer)&SystemToolsAppendComponents(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>)
                     ::up_abi_cxx11_.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)
                 &SystemToolsAppendComponents(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>)
                  ::up_abi_cxx11_,"..","");
      __cxa_atexit(std::__cxx11::string::~string,
                   &SystemToolsAppendComponents(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>)
                    ::up_abi_cxx11_,&__dso_handle);
      __cxa_guard_release(&SystemToolsAppendComponents(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>)
                           ::up_abi_cxx11_);
    }
  }
  if (SystemToolsAppendComponents(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>)
      ::cur_abi_cxx11_ == '\0') {
    iVar1 = __cxa_guard_acquire(&SystemToolsAppendComponents(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>)
                                 ::cur_abi_cxx11_);
    if (iVar1 != 0) {
      SystemToolsAppendComponents(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>)
      ::cur_abi_cxx11_._M_dataplus._M_p =
           (pointer)&SystemToolsAppendComponents(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>)
                     ::cur_abi_cxx11_.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)
                 &SystemToolsAppendComponents(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>)
                  ::cur_abi_cxx11_,".","");
      __cxa_atexit(std::__cxx11::string::~string,
                   &SystemToolsAppendComponents(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>)
                    ::cur_abi_cxx11_,&__dso_handle);
      __cxa_guard_release(&SystemToolsAppendComponents(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>)
                           ::cur_abi_cxx11_);
    }
  }
  do {
    if (first._M_current == last._M_current) {
      return;
    }
    __n = (first._M_current)->_M_string_length;
    if (__n == SystemToolsAppendComponents(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>)
               ::up_abi_cxx11_._M_string_length) {
      if (__n != 0) {
        iVar1 = bcmp(((first._M_current)->_M_dataplus)._M_p,
                     SystemToolsAppendComponents(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>)
                     ::up_abi_cxx11_._M_dataplus._M_p,__n);
        if (iVar1 != 0) goto LAB_0048a01b;
      }
      uVar2 = (long)(out_components->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish -
              (long)(out_components->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_start >> 5;
      if (1 < uVar2) {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::resize(out_components,uVar2 - 1);
      }
    }
    else {
LAB_0048a01b:
      if (__n != 0) {
        if (__n == SystemToolsAppendComponents(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>)
                   ::cur_abi_cxx11_._M_string_length) {
          iVar1 = bcmp(((first._M_current)->_M_dataplus)._M_p,
                       SystemToolsAppendComponents(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>)
                       ::cur_abi_cxx11_._M_dataplus._M_p,__n);
          if (iVar1 == 0) goto LAB_0048a068;
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(out_components,first._M_current);
      }
    }
LAB_0048a068:
    first._M_current = first._M_current + 1;
  } while( true );
}

Assistant:

static void SystemToolsAppendComponents(
  std::vector<std::string>& out_components,
  std::vector<std::string>::const_iterator first,
  std::vector<std::string>::const_iterator last)
{
  static const std::string up = "..";
  static const std::string cur = ".";
  for (std::vector<std::string>::const_iterator i = first; i != last; ++i) {
    if (*i == up) {
      if (out_components.size() > 1) {
        out_components.resize(out_components.size() - 1);
      }
    } else if (!i->empty() && *i != cur) {
      out_components.push_back(*i);
    }
  }
}